

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O2

ReadStatus __thiscall
PartiallyDownloadedBlock::InitData
          (PartiallyDownloadedBlock *this,CBlockHeaderAndShortTxIDs *cmpctblock,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *extra_txn)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long *plVar4;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  bool bVar11;
  pointer pPVar12;
  size_t __new_size;
  ulong uVar13;
  mapped_type *pmVar14;
  size_type sVar15;
  iterator iVar16;
  long lVar17;
  ulong uVar18;
  ReadStatus RVar19;
  Level level;
  pointer pPVar20;
  CBlockHeader *pCVar21;
  RecursiveMutex *mutexIn;
  CBlockHeader *pCVar22;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  size_t i_1;
  uint uVar23;
  size_t i_2;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var24;
  size_t i;
  ulong uVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  string_view source_file;
  reference rVar27;
  string_view logging_function;
  long lVar28;
  size_t local_e0;
  unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
  shorttxids;
  vector<bool,_std::allocator<bool>_> have_txn;
  uint64_t shortid;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RVar19 = READ_STATUS_INVALID;
  if ((cmpctblock->header).nBits == 0) goto LAB_006bbf3e;
  puVar2 = (cmpctblock->shorttxids).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (cmpctblock->shorttxids).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    pPVar20 = (cmpctblock->prefilledtxn).
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar12 = (cmpctblock->prefilledtxn).
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar20 == pPVar12) goto LAB_006bbf3e;
  }
  else {
    pPVar20 = (cmpctblock->prefilledtxn).
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar12 = (cmpctblock->prefilledtxn).
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (((100000 < (ulong)(((long)pPVar12 - (long)pPVar20) / 0x18 + ((long)puVar3 - (long)puVar2 >> 3)
                        )) || ((this->header).nBits != 0)) ||
     ((this->txn_available).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->txn_available).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_006bbf3e;
  pCVar21 = &cmpctblock->header;
  pCVar22 = &this->header;
  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
    uVar7 = (pCVar21->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0];
    uVar8 = (pCVar21->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1];
    uVar9 = (pCVar21->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2];
    uVar10 = (pCVar21->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3];
    pCVar22->nVersion = pCVar21->nVersion;
    (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = uVar7;
    (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = uVar8;
    (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = uVar9;
    (pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = uVar10;
    pCVar21 = (CBlockHeader *)((pCVar21->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
    pCVar22 = (CBlockHeader *)((pCVar22->hashPrevBlock).super_base_blob<256U>.m_data._M_elems + 4);
  }
  __new_size = CBlockHeaderAndShortTxIDs::BlockTxCount(cmpctblock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&this->txn_available,__new_size);
  uVar23 = 0xffffffff;
  lVar17 = 8;
  uVar25 = 0;
  while( true ) {
    pPVar20 = (cmpctblock->prefilledtxn).
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = ((long)(cmpctblock->prefilledtxn).
                    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar20) / 0x18;
    if (uVar13 <= uVar25) break;
    plVar4 = *(long **)((long)&pPVar20->index + lVar17);
    if ((*plVar4 == plVar4[1]) && (plVar4[3] == plVar4[4])) goto LAB_006bbf3e;
    p_Var24 = (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)&pPVar20->index + lVar17);
    uVar23 = uVar23 + *(ushort *)&p_Var24[-1]._M_refcount._M_pi + 1;
    if ((0xffff < (int)uVar23) ||
       (((long)(cmpctblock->shorttxids).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(cmpctblock->shorttxids).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) + uVar25 < (ulong)uVar23)) goto LAB_006bbf3e;
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->txn_available).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23].
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,p_Var24);
    uVar25 = uVar25 + 1;
    lVar17 = lVar17 + 0x18;
  }
  this->prefilled_count = uVar13;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&shorttxids._M_h,
               (long)(cmpctblock->shorttxids).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cmpctblock->shorttxids).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(hash<unsigned_long> *)&have_txn,
               (key_equal *)&criticalblock7,(allocator_type *)&shortid);
  uVar13 = 0;
  RVar19 = READ_STATUS_FAILED;
  uVar25 = 0;
  do {
    puVar2 = (cmpctblock->shorttxids).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (long)(cmpctblock->shorttxids).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
    if (uVar18 <= uVar25) {
      if (shorttxids._M_h._M_element_count == uVar18) {
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&have_txn,
                   (long)(this->txn_available).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->txn_available).
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4,
                   (allocator_type *)&criticalblock7);
        mutexIn = &this->pool->cs;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock7,mutexIn,"pool->cs",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
                   ,0x6d,false);
        p_Var24 = &((this->pool->txns_randomized).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
        p_Var5 = &((this->pool->txns_randomized).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
        goto LAB_006bc13b;
      }
      break;
    }
    uVar18 = uVar13;
    do {
      uVar13 = uVar18;
      lVar17 = (uVar13 & 0xffff) + uVar25;
      uVar18 = (ulong)((int)uVar13 + 1);
    } while ((this->txn_available).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar17].
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0);
    pmVar14 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&shorttxids._M_h,puVar2 + uVar25);
    *pmVar14 = (mapped_type)lVar17;
    sVar15 = std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::bucket_size(&shorttxids._M_h,
                           (cmpctblock->shorttxids).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar25] %
                           shorttxids._M_h._M_bucket_count);
    uVar25 = uVar25 + 1;
  } while (sVar15 < 0xd);
  goto LAB_006bc385;
LAB_006bc13b:
  do {
    if (p_Var24 == p_Var5) break;
    shortid = CBlockHeaderAndShortTxIDs::GetShortID(cmpctblock,&p_Var24->_M_ptr->m_witness_hash);
    mutexIn = (RecursiveMutex *)&shortid;
    iVar16 = std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&shorttxids._M_h,(key_type *)mutexIn);
    if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>.
        _M_cur != (__node_type *)0x0) {
      mutexIn = (RecursiveMutex *)
                (ulong)*(ushort *)
                        ((long)iVar16.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                               ._M_cur + 0x10);
      rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&have_txn,(size_type)mutexIn);
      this_00 = &(this->txn_available).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(ushort *)
                   ((long)iVar16.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                          ._M_cur + 0x10)].
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
      if ((*rVar27._M_p & rVar27._M_mask) == 0) {
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,p_Var24);
        mutexIn = (RecursiveMutex *)
                  (ulong)*(ushort *)
                          ((long)iVar16.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                 ._M_cur + 0x10);
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&have_txn,(size_type)mutexIn);
        *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
        lVar17 = 1;
      }
      else {
        if (this_00->_M_ptr == (element_type *)0x0) goto LAB_006bc1c2;
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
        lVar17 = -1;
      }
      this->mempool_count = this->mempool_count + lVar17;
    }
LAB_006bc1c2:
    p_Var24 = p_Var24 + 1;
  } while (this->mempool_count != shorttxids._M_h._M_element_count);
  this_01 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)&criticalblock7;
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)this_01)
  ;
  lVar17 = 0;
  uVar25 = 0;
  while( true ) {
    level = (Level)mutexIn;
    psVar6 = (extra_txn->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(extra_txn->
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4) <= uVar25)
    break;
    mutexIn = *(RecursiveMutex **)
               ((long)&(psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar17);
    if (mutexIn != (RecursiveMutex *)0x0) {
      criticalblock7.super_unique_lock._M_device =
           (mutex_type *)
           CBlockHeaderAndShortTxIDs::GetShortID(cmpctblock,(Wtxid *)((long)(mutexIn + 2) + 9));
      this_01 = &shorttxids._M_h;
      mutexIn = (RecursiveMutex *)&criticalblock7;
      iVar16 = std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(this_01,(key_type *)mutexIn);
      if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>.
          _M_cur != (__node_type *)0x0) {
        mutexIn = (RecursiveMutex *)
                  (ulong)*(ushort *)
                          ((long)iVar16.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                 ._M_cur + 0x10);
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&have_txn,(size_type)mutexIn);
        if ((*rVar27._M_p & rVar27._M_mask) == 0) {
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->txn_available).
                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(ushort *)
                        ((long)iVar16.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                               ._M_cur + 0x10)].
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(((extra_txn->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar17));
          mutexIn = (RecursiveMutex *)
                    (ulong)*(ushort *)
                            ((long)iVar16.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                   ._M_cur + 0x10);
          this_01 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&have_txn;
          rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)this_01,(size_type)mutexIn);
          *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
          lVar28 = 1;
LAB_006bc2c0:
          auVar26._8_4_ = (int)lVar28;
          auVar26._0_8_ = lVar28;
          auVar26._12_4_ = (int)((ulong)lVar28 >> 0x20);
          this->mempool_count = lVar28 + this->mempool_count;
          this->extra_count = auVar26._8_8_ + this->extra_count;
        }
        else {
          this_01 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(this->txn_available).
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(ushort *)
                         ((long)iVar16.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                ._M_cur + 0x10)].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (this_01 !=
              (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)0x0) {
            this_01 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)((long)&this_01[1]._M_rehash_policy._M_max_load_factor + 1);
            mutexIn = (RecursiveMutex *)
                      (*(long *)((long)&(((extra_txn->
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + lVar17) + 0x59);
            bVar11 = transaction_identifier<true>::operator!=
                               ((transaction_identifier<true> *)this_01,
                                (transaction_identifier<true> *)mutexIn);
            if (bVar11) {
              this_01 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)((this->txn_available).
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           *(ushort *)
                            ((long)iVar16.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                   ._M_cur + 0x10));
              std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::reset
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this_01);
              lVar28 = -1;
              goto LAB_006bc2c0;
            }
          }
        }
      }
      level = (Level)mutexIn;
      if (this->mempool_count == shorttxids._M_h._M_element_count) break;
    }
    uVar25 = uVar25 + 1;
    lVar17 = lVar17 + 0x10;
  }
  bVar11 = ::LogAcceptCategory((LogFlags)this_01,level);
  if (bVar11) {
    CBlockHeader::GetHash((uint256 *)&shortid,&cmpctblock->header);
    base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock7,(base_blob<256u> *)&shortid);
    local_e0 = GetSerializeSize<CBlockHeaderAndShortTxIDs>(cmpctblock);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
    ;
    source_file._M_len = 0x62;
    logging_function._M_str = "InitData";
    logging_function._M_len = 8;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_long>
              (logging_function,source_file,0xaa,CMPCTBLOCK,Debug,
               (ConstevalFormatString<2U>)0xc8ca2c,(string *)&criticalblock7,&local_e0);
    std::__cxx11::string::~string((string *)&criticalblock7);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&have_txn.super__Bvector_base<std::allocator<bool>_>);
  RVar19 = READ_STATUS_OK;
LAB_006bc385:
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_short>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&shorttxids._M_h);
LAB_006bbf3e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return RVar19;
}

Assistant:

ReadStatus PartiallyDownloadedBlock::InitData(const CBlockHeaderAndShortTxIDs& cmpctblock, const std::vector<CTransactionRef>& extra_txn) {
    if (cmpctblock.header.IsNull() || (cmpctblock.shorttxids.empty() && cmpctblock.prefilledtxn.empty()))
        return READ_STATUS_INVALID;
    if (cmpctblock.shorttxids.size() + cmpctblock.prefilledtxn.size() > MAX_BLOCK_WEIGHT / MIN_SERIALIZABLE_TRANSACTION_WEIGHT)
        return READ_STATUS_INVALID;

    if (!header.IsNull() || !txn_available.empty()) return READ_STATUS_INVALID;

    header = cmpctblock.header;
    txn_available.resize(cmpctblock.BlockTxCount());

    int32_t lastprefilledindex = -1;
    for (size_t i = 0; i < cmpctblock.prefilledtxn.size(); i++) {
        if (cmpctblock.prefilledtxn[i].tx->IsNull())
            return READ_STATUS_INVALID;

        lastprefilledindex += cmpctblock.prefilledtxn[i].index + 1; //index is a uint16_t, so can't overflow here
        if (lastprefilledindex > std::numeric_limits<uint16_t>::max())
            return READ_STATUS_INVALID;
        if ((uint32_t)lastprefilledindex > cmpctblock.shorttxids.size() + i) {
            // If we are inserting a tx at an index greater than our full list of shorttxids
            // plus the number of prefilled txn we've inserted, then we have txn for which we
            // have neither a prefilled txn or a shorttxid!
            return READ_STATUS_INVALID;
        }
        txn_available[lastprefilledindex] = cmpctblock.prefilledtxn[i].tx;
    }
    prefilled_count = cmpctblock.prefilledtxn.size();

    // Calculate map of txids -> positions and check mempool to see what we have (or don't)
    // Because well-formed cmpctblock messages will have a (relatively) uniform distribution
    // of short IDs, any highly-uneven distribution of elements can be safely treated as a
    // READ_STATUS_FAILED.
    std::unordered_map<uint64_t, uint16_t> shorttxids(cmpctblock.shorttxids.size());
    uint16_t index_offset = 0;
    for (size_t i = 0; i < cmpctblock.shorttxids.size(); i++) {
        while (txn_available[i + index_offset])
            index_offset++;
        shorttxids[cmpctblock.shorttxids[i]] = i + index_offset;
        // To determine the chance that the number of entries in a bucket exceeds N,
        // we use the fact that the number of elements in a single bucket is
        // binomially distributed (with n = the number of shorttxids S, and p =
        // 1 / the number of buckets), that in the worst case the number of buckets is
        // equal to S (due to std::unordered_map having a default load factor of 1.0),
        // and that the chance for any bucket to exceed N elements is at most
        // buckets * (the chance that any given bucket is above N elements).
        // Thus: P(max_elements_per_bucket > N) <= S * (1 - cdf(binomial(n=S,p=1/S), N)).
        // If we assume blocks of up to 16000, allowing 12 elements per bucket should
        // only fail once per ~1 million block transfers (per peer and connection).
        if (shorttxids.bucket_size(shorttxids.bucket(cmpctblock.shorttxids[i])) > 12)
            return READ_STATUS_FAILED;
    }
    // TODO: in the shortid-collision case, we should instead request both transactions
    // which collided. Falling back to full-block-request here is overkill.
    if (shorttxids.size() != cmpctblock.shorttxids.size())
        return READ_STATUS_FAILED; // Short ID collision

    std::vector<bool> have_txn(txn_available.size());
    {
    LOCK(pool->cs);
    for (const auto& tx : pool->txns_randomized) {
        uint64_t shortid = cmpctblock.GetShortID(tx->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = tx;
                have_txn[idit->second]  = true;
                mempool_count++;
            } else {
                // If we find two mempool txn that match the short id, just request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                if (txn_available[idit->second]) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }
    }

    for (size_t i = 0; i < extra_txn.size(); i++) {
        if (extra_txn[i] == nullptr) {
            continue;
        }
        uint64_t shortid = cmpctblock.GetShortID(extra_txn[i]->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = extra_txn[i];
                have_txn[idit->second]  = true;
                mempool_count++;
                extra_count++;
            } else {
                // If we find two mempool/extra txn that match the short id, just
                // request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                // Note that we don't want duplication between extra_txn and mempool to
                // trigger this case, so we compare witness hashes first
                if (txn_available[idit->second] &&
                        txn_available[idit->second]->GetWitnessHash() != extra_txn[i]->GetWitnessHash()) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                    extra_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Initialized PartiallyDownloadedBlock for block %s using a cmpctblock of size %lu\n", cmpctblock.header.GetHash().ToString(), GetSerializeSize(cmpctblock));

    return READ_STATUS_OK;
}